

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_2ddrawer.cpp
# Opt level: O3

int __thiscall F2DDrawer::AddData(F2DDrawer *this,DataGeneric *data)

{
  uint amount;
  uint uVar1;
  
  amount = data->mLen;
  TArray<unsigned_char,_unsigned_char>::Grow(&this->mData,amount);
  uVar1 = (this->mData).Count;
  (this->mData).Count = amount + uVar1;
  memcpy((this->mData).Array + (int)uVar1,data,(ulong)data->mLen);
  this->mLastLineCmd = -1;
  return uVar1;
}

Assistant:

int F2DDrawer::AddData(const F2DDrawer::DataGeneric *data)
{
	int addr = mData.Reserve(data->mLen);
	memcpy(&mData[addr], data, data->mLen);
	mLastLineCmd = -1;
	return addr;
}